

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O3

size_t mbedtls_ssl_get_output_max_frag_len(mbedtls_ssl_context *ssl)

{
  uchar uVar1;
  uint uVar2;
  byte bVar3;
  uint uVar4;
  
  bVar3 = ssl->conf->mfl_code - 1;
  uVar2 = 0x400;
  if (bVar3 < 4) {
    uVar2 = *(uint *)(&DAT_0021a330 + (ulong)bVar3 * 4);
  }
  if (ssl->session_out != (mbedtls_ssl_session *)0x0) {
    uVar1 = ssl->session_out->mfl_code;
    if (uVar1 != '\x04') {
      if (uVar1 == '\x03') {
        uVar4 = 0x800;
      }
      else {
        uVar4 = 0x400;
        if (uVar1 == '\x01') {
          uVar4 = 0x200;
        }
      }
      if (uVar4 < uVar2) {
        uVar2 = 0x400;
        if ((byte)(uVar1 - 1) < 4) {
          uVar2 = *(uint *)(&DAT_0021a330 + (ulong)(byte)(uVar1 - 1) * 4);
        }
      }
    }
  }
  if (ssl->session_negotiate != (mbedtls_ssl_session *)0x0) {
    uVar1 = ssl->session_negotiate->mfl_code;
    if (uVar1 != '\x04') {
      if (uVar1 == '\x03') {
        uVar4 = 0x800;
      }
      else {
        uVar4 = 0x400;
        if (uVar1 == '\x01') {
          uVar4 = 0x200;
        }
      }
      if (uVar4 < uVar2) {
        uVar2 = 0x400;
        if ((byte)(uVar1 - 1) < 4) {
          uVar2 = *(uint *)(&DAT_0021a330 + (ulong)(byte)(uVar1 - 1) * 4);
        }
      }
    }
  }
  return (ulong)uVar2;
}

Assistant:

size_t mbedtls_ssl_get_output_max_frag_len(const mbedtls_ssl_context *ssl)
{
    size_t max_len;

    /*
     * Assume mfl_code is correct since it was checked when set
     */
    max_len = ssl_mfl_code_to_length(ssl->conf->mfl_code);

    /* Check if a smaller max length was negotiated */
    if (ssl->session_out != NULL &&
        ssl_mfl_code_to_length(ssl->session_out->mfl_code) < max_len) {
        max_len = ssl_mfl_code_to_length(ssl->session_out->mfl_code);
    }

    /* During a handshake, use the value being negotiated */
    if (ssl->session_negotiate != NULL &&
        ssl_mfl_code_to_length(ssl->session_negotiate->mfl_code) < max_len) {
        max_len = ssl_mfl_code_to_length(ssl->session_negotiate->mfl_code);
    }

    return max_len;
}